

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.c
# Opt level: O2

ethash_return_value_t *
ethash_light_compute
          (ethash_return_value_t *__return_storage_ptr__,ethash_light_t light,
          ethash_h256_t header_hash,uint64_t nonce)

{
  uint64_t full_size;
  _Bool _Var1;
  
  full_size = dag_sizes[light->block_number / 30000];
  __return_storage_ptr__->success = true;
  _Var1 = ethash_hash(__return_storage_ptr__,(node *)0x0,light,full_size,header_hash,nonce);
  if (!_Var1) {
    __return_storage_ptr__->success = false;
  }
  return __return_storage_ptr__;
}

Assistant:

ethash_return_value_t ethash_light_compute(
	ethash_light_t light,
	ethash_h256_t const header_hash,
	uint64_t nonce
)
{
	uint64_t full_size = ethash_get_datasize(light->block_number);
	return ethash_light_compute_internal(light, full_size, header_hash, nonce);
}